

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatBuffer.h
# Opt level: O0

void __thiscall
slang::FormatBuffer::format<std::basic_string_view<char,std::char_traits<char>>const&>
          (FormatBuffer *this,format_string<const_std::basic_string_view<char>_&> fmt,
          basic_string_view<char,_std::char_traits<char>_> *args)

{
  locale_ref in_stack_00000060;
  undefined1 in_stack_00000068 [16];
  undefined1 in_stack_00000078 [16];
  locale_ref local_90;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff78;
  value<fmt::v11::context> *in_stack_ffffffffffffff80;
  undefined8 local_78;
  undefined1 *local_70;
  undefined1 local_48 [16];
  undefined1 *local_38;
  undefined1 *local_10;
  undefined8 *local_8;
  
  local_38 = local_48;
  ::fmt::v11::detail::value<fmt::v11::context>::
  value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  local_8 = &local_78;
  local_10 = &stack0xffffffffffffff78;
  local_78 = 0xd;
  local_70 = local_10;
  ::fmt::v11::detail::locale_ref::locale_ref(&local_90);
  ::fmt::v11::detail::vformat_to
            ((buffer<char> *)fmt.str.size_,(string_view)in_stack_00000078,
             (format_args)in_stack_00000068,in_stack_00000060);
  return;
}

Assistant:

void format(fmt::format_string<Args...> fmt, Args&&... args) {
        fmt::detail::vformat_to(buf, fmt::string_view(fmt), fmt::make_format_args(args...));
    }